

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV newP11Object(OSObject *object,P11Object **p11object)

{
  ulong uVar1;
  undefined8 *in_RSI;
  long *in_RDI;
  CK_RV rv;
  CK_CERTIFICATE_TYPE certType;
  CK_KEY_TYPE keyType;
  CK_OBJECT_CLASS objClass;
  P11Object **in_stack_00000090;
  CK_CERTIFICATE_TYPE in_stack_00000098;
  CK_KEY_TYPE in_stack_000000a0;
  CK_OBJECT_CLASS in_stack_000000a8;
  undefined8 local_8;
  
  (**(code **)(*in_RDI + 0x28))(in_RDI,0,0x80000000);
  uVar1 = (**(code **)(*in_RDI + 0x10))(in_RDI,0x100);
  if ((uVar1 & 1) != 0) {
    (**(code **)(*in_RDI + 0x28))(in_RDI,0x100,0);
  }
  uVar1 = (**(code **)(*in_RDI + 0x10))(in_RDI,0x80);
  if ((uVar1 & 1) != 0) {
    (**(code **)(*in_RDI + 0x28))(in_RDI,0x80,0);
  }
  local_8 = newP11Object(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  if (local_8 == 0) {
    uVar1 = (**(code **)(*(long *)*in_RSI + 0x10))((long *)*in_RSI,in_RDI);
    if ((uVar1 & 1) == 0) {
      local_8 = 5;
    }
    else {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

static CK_RV newP11Object(OSObject *object, P11Object **p11object)
{
	CK_OBJECT_CLASS objClass = object->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED);
	CK_KEY_TYPE keyType = CKK_RSA;
	CK_CERTIFICATE_TYPE certType = CKC_X_509;
	if (object->attributeExists(CKA_KEY_TYPE))
		keyType = object->getUnsignedLongValue(CKA_KEY_TYPE, CKK_RSA);
	if (object->attributeExists(CKA_CERTIFICATE_TYPE))
		certType = object->getUnsignedLongValue(CKA_CERTIFICATE_TYPE, CKC_X_509);
	CK_RV rv = newP11Object(objClass,keyType,certType,p11object);
	if (rv != CKR_OK)
		return rv;
	if (!(*p11object)->init(object))
		return CKR_GENERAL_ERROR; // something went wrong that shouldn't have.
	return CKR_OK;
}